

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.hpp
# Opt level: O0

int __thiscall BCL::int_compare_and_swap(BCL *this,GlobalPtr<int> ptr,int old_val,int new_val)

{
  debug_error *pdVar1;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_75;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  int local_28;
  int local_24;
  int error_code;
  int result;
  int new_val_local;
  int old_val_local;
  GlobalPtr<int> ptr_local;
  
  ptr_local.rank = ptr.rank;
  result = (int)ptr.ptr;
  error_code = old_val;
  _new_val_local = this;
  local_28 = MPI_Compare_and_swap
                       (&error_code,&result,&local_24,&ompi_mpi_int,(ulong)this & 0xffffffff,
                        ptr_local.rank,win);
  if (local_28 != 0) {
    local_75 = 1;
    pdVar1 = (debug_error *)__cxa_allocate_exception(0x40);
    std::__cxx11::to_string(&local_68,local_28);
    std::operator+(&local_48,"BCL int_compare_and_swap(): MPI_Compare_and_swap return error code ",
                   &local_68);
    debug_error::debug_error(pdVar1,&local_48);
    local_75 = 0;
    __cxa_throw(pdVar1,&debug_error::typeinfo,debug_error::~debug_error);
  }
  local_28 = MPI_Win_flush_local((ulong)_new_val_local & 0xffffffff,win);
  if (local_28 != 0) {
    pdVar1 = (debug_error *)__cxa_allocate_exception(0x40);
    std::__cxx11::to_string(&local_b8,local_28);
    std::operator+(&local_98,"BCL int_compare_and_swap(): MPI_Win_flush_local return error code ",
                   &local_b8);
    debug_error::debug_error(pdVar1,&local_98);
    __cxa_throw(pdVar1,&debug_error::typeinfo,debug_error::~debug_error);
  }
  return local_24;
}

Assistant:

inline int int_compare_and_swap(const GlobalPtr <int> ptr, const int old_val,
  const int new_val) {
  int result;

  int error_code = MPI_Compare_and_swap(&new_val, &old_val, &result, MPI_INT, ptr.rank, ptr.ptr, BCL::win);
  BCL_DEBUG(
          if (error_code != MPI_SUCCESS) {
            throw debug_error("BCL int_compare_and_swap(): MPI_Compare_and_swap return error code " + std::to_string(error_code));
          }
  )

  error_code = MPI_Win_flush_local(ptr.rank, BCL::win);
  BCL_DEBUG(
          if (error_code != MPI_SUCCESS) {
            throw debug_error("BCL int_compare_and_swap(): MPI_Win_flush_local return error code " + std::to_string(error_code));
          }
  )
  return result;
}